

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckDepth(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLfloat (*paGVar2) [3];
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  GLfloat depth [2] [3];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar5 = &local_1b8;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1902,0x1406,puVar5);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb96);
  paGVar2 = CheckDepth::reference;
  bVar6 = false;
  lVar4 = 0;
  do {
    lVar3 = 0;
    do {
      fVar7 = (*paGVar2)[lVar3] - *(float *)((long)puVar5 + lVar3 * 4);
      fVar8 = -fVar7;
      if (-fVar7 <= fVar7) {
        fVar8 = fVar7;
      }
      if (0.015625 < fVar8) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Blitted framebuffer depth buffer contains [",0x2b);
        std::ostream::_M_insert<double>((double)(float)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1b8._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)(float)uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::_M_insert<double>((double)uStack_1b0._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)(float)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>((double)local_1a8._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], but ",7);
        std::ostream::_M_insert<double>(0.5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.125);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::_M_insert<double>(0.0625);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] was expected.",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_128);
        return bVar6;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    paGVar2 = paGVar2 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 0xc);
    bVar6 = lVar4 != 0;
    lVar4 = lVar4 + 1;
    if (bVar6) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool BlitTest::CheckDepth()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3] = { { 0.5, 0.25, 0.125 }, { 0.0625, 0.0625, 0.0625 } };

	/* Copy buffer. */
	glw::GLfloat depth[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_DEPTH_COMPONENT, GL_FLOAT, depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (de::abs(reference[j][i] - depth[j][i]) > (1.f / 64.f) /* Precision. */)
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer depth buffer contains [" << depth[0][0] << ", "
					<< depth[0][1] << ", " << depth[0][2] << ", \n"
					<< depth[1][0] << ", " << depth[1][1] << ", " << depth[1][2] << "], but " << reference[0][0] << ", "
					<< reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}